

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O1

bool __thiscall
cmOrderDirectoriesConstraintLibrary::FindConflict
          (cmOrderDirectoriesConstraintLibrary *this,string *dir)

{
  string *name;
  cmOrderDirectories *pcVar1;
  char *pcVar2;
  pointer pbVar3;
  size_t __n;
  bool bVar4;
  bool bVar5;
  int iVar6;
  pointer pbVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string ext;
  string lib;
  string fname;
  undefined1 *local_b8;
  size_t local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  char *local_98;
  size_t local_90;
  char local_88;
  undefined7 uStack_87;
  string *local_78;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_type local_40;
  pointer local_38;
  
  name = &(this->super_cmOrderDirectoriesConstraint).FileName;
  local_78 = dir;
  bVar4 = cmOrderDirectoriesConstraint::FileMayConflict
                    (&this->super_cmOrderDirectoriesConstraint,dir,name);
  bVar5 = true;
  if (!bVar4) {
    pcVar1 = (this->super_cmOrderDirectoriesConstraint).OD;
    if (((pcVar1->LinkExtensions).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (pcVar1->LinkExtensions).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (bVar4 = cmsys::RegularExpression::find
                          (&pcVar1->RemoveLibraryExtension,(name->_M_dataplus)._M_p,
                           &(pcVar1->RemoveLibraryExtension).regmatch), bVar4)) {
      pcVar1 = (this->super_cmOrderDirectoriesConstraint).OD;
      pcVar2 = (pcVar1->RemoveLibraryExtension).regmatch.startp[1];
      if (pcVar2 == (char *)0x0) {
        local_98 = &local_88;
        local_90 = 0;
        local_88 = '\0';
      }
      else {
        local_98 = &local_88;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,pcVar2,(pcVar1->RemoveLibraryExtension).regmatch.endp[1]);
      }
      pcVar1 = (this->super_cmOrderDirectoriesConstraint).OD;
      pcVar2 = (pcVar1->RemoveLibraryExtension).regmatch.startp[2];
      if (pcVar2 == (char *)0x0) {
        local_b8 = &local_a8;
        local_b0 = 0;
        local_a8 = 0;
      }
      else {
        local_b8 = &local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,pcVar2,(pcVar1->RemoveLibraryExtension).regmatch.endp[2]);
      }
      pcVar1 = (this->super_cmOrderDirectoriesConstraint).OD;
      pbVar7 = (pcVar1->LinkExtensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (pcVar1->LinkExtensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar4 = pbVar7 == pbVar3;
      if (!bVar4) {
        do {
          __n = pbVar7->_M_string_length;
          if ((__n != local_b0) ||
             ((__n != 0 && (iVar6 = bcmp((pbVar7->_M_dataplus)._M_p,local_b8,__n), iVar6 != 0)))) {
            local_38 = (pbVar7->_M_dataplus)._M_p;
            local_40 = pbVar7->_M_string_length;
            local_50._M_len = local_90;
            local_50._M_str = local_98;
            views._M_len = 2;
            views._M_array = &local_50;
            cmCatViews_abi_cxx11_(&local_70,views);
            bVar5 = cmOrderDirectoriesConstraint::FileMayConflict
                              (&this->super_cmOrderDirectoriesConstraint,local_78,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if (bVar5) break;
          }
          pbVar7 = pbVar7 + 1;
          bVar4 = pbVar7 == pbVar3;
        } while (!bVar4);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
      }
      if (!bVar4) {
        return true;
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool cmOrderDirectoriesConstraintLibrary::FindConflict(std::string const& dir)
{
  // We have the library file name.  Check if it will be found.
  if (this->FileMayConflict(dir, this->FileName)) {
    return true;
  }

  // Now check if the file exists with other extensions the linker
  // might consider.
  if (!this->OD->LinkExtensions.empty() &&
      this->OD->RemoveLibraryExtension.find(this->FileName)) {
    std::string lib = this->OD->RemoveLibraryExtension.match(1);
    std::string ext = this->OD->RemoveLibraryExtension.match(2);
    for (std::string const& LinkExtension : this->OD->LinkExtensions) {
      if (LinkExtension != ext) {
        std::string fname = cmStrCat(lib, LinkExtension);
        if (this->FileMayConflict(dir, fname)) {
          return true;
        }
      }
    }
  }
  return false;
}